

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboteqInterface.cpp
# Opt level: O2

int handleroboteqinterface(RS232PORT *pRoboteqInterfacePseudoRS232Port)

{
  int iVar1;
  uint8 *puVar2;
  char *pcVar3;
  uint8 *writebuf;
  double *pdVar4;
  uint uVar5;
  int spd;
  int chan;
  int Bytes;
  char recvbuf [2048];
  
  Bytes = 0;
  chan = 0;
  spd = 0;
  iVar1 = CheckAvailBytesRS232Port(pRoboteqInterfacePseudoRS232Port,(int *)0x0);
  if (iVar1 != 0) {
    uSleep(50000);
    return 0;
  }
  uVar5 = 0;
  memset(recvbuf,0,0x800);
  do {
    if (0 < (int)uVar5) {
      if (recvbuf[uVar5 - 1] == '\r') {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        puVar2 = (uint8 *)strchr(recvbuf,0x3f);
        break;
      }
      if (0x7ff < uVar5) {
        return 1;
      }
    }
    iVar1 = ReadRS232Port(pRoboteqInterfacePseudoRS232Port,(uint8 *)(recvbuf + (int)uVar5),1,&Bytes)
    ;
    if (iVar1 != 0) {
      return 1;
    }
    uVar5 = uVar5 + Bytes;
    if (Bytes == 0) {
      return 1;
    }
  } while( true );
LAB_0016a94f:
  if (puVar2 == (uint8 *)0x0) goto LAB_0016a9d3;
  iVar1 = strncmp((char *)puVar2,"?FID",4);
  if ((iVar1 == 0) &&
     (((pcVar3 = strchr((char *)puVar2,0xd), pcVar3 == (char *)0x0 ||
       (iVar1 = WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port,puVar2,
                                  ((int)pcVar3 - (int)puVar2) + 1), iVar1 != 0)) ||
      (iVar1 = WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port,
                                 (uint8 *)"FID=Roboteq v0.0 EMULATED 12/12/2023\r",0x25), iVar1 != 0
      )))) goto LAB_0016ab90;
  if (0x7fd < (long)(recvbuf + -(long)puVar2)) goto LAB_0016a9d3;
  puVar2 = (uint8 *)strchr((char *)(puVar2 + 1),0x3f);
  goto LAB_0016a94f;
LAB_0016a9d3:
  puVar2 = (uint8 *)recvbuf;
  do {
    writebuf = (uint8 *)strchr((char *)puVar2,0x21);
    if (writebuf == (uint8 *)0x0) break;
    iVar1 = __isoc99_sscanf(writebuf,"!G %d %d",&chan,&spd);
    if ((iVar1 == 2) || (iVar1 = __isoc99_sscanf(writebuf,"!$00 %d %d",&chan,&spd), iVar1 == 2)) {
      pcVar3 = strchr((char *)writebuf,0xd);
      if ((pcVar3 == (char *)0x0) ||
         ((iVar1 = WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port,writebuf,
                                     ((int)pcVar3 - (int)writebuf) + 1), iVar1 != 0 ||
          (iVar1 = WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port,(uint8 *)"+\r",2), iVar1 != 0)
          ))) {
LAB_0016ab90:
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        return 1;
      }
      if (((((robid == 0x1000) || (robid == 0x2000)) || (robid == 0x4000)) ||
          ((robid == 0x8000 || (robid == 0x200000)))) || (robid == 0x100000)) {
        pdVar4 = &roboteq_u1;
        if (chan == 1) {
LAB_0016aad3:
          *pdVar4 = (double)spd / 1000.0;
        }
        else if (chan == 2) {
          pdVar4 = &roboteq_u2;
          goto LAB_0016aad3;
        }
        u = roboteq_u2;
        uw = roboteq_u1;
      }
      else {
        pdVar4 = &roboteq_u1;
        if (chan == 1) {
LAB_0016ab3d:
          *pdVar4 = (double)spd / 1000.0;
        }
        else if (chan == 2) {
          pdVar4 = &roboteq_u2;
          goto LAB_0016ab3d;
        }
        u = (roboteq_u1 + roboteq_u2) * 0.5;
        uw = (roboteq_u2 - roboteq_u1) * 0.5;
      }
    }
    puVar2 = writebuf + 1;
  } while ((long)(recvbuf + -(long)writebuf) < 0x7fe);
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  return 0;
}

Assistant:

int handleroboteqinterface(RS232PORT* pRoboteqInterfacePseudoRS232Port)
{
	char recvbuf[MAX_NB_BYTES_ROBOTEQ];
	int Bytes = 0, BytesReceived = 0, maxrecvbuflen = MAX_NB_BYTES_ROBOTEQ, chan = 0, spd = 0;
	char endchar = '\r';
	char* tmp = NULL;
	char* tmp2 = NULL;

	// Get data...
	if (CheckAvailBytesRS232Port(pRoboteqInterfacePseudoRS232Port, NULL) == EXIT_SUCCESS)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));

		// Receive byte per byte.
		while ((BytesReceived <= 0)||(recvbuf[BytesReceived-1] != endchar))
		{
			if (BytesReceived >= maxrecvbuflen)
			{
				return EXIT_FAILURE;
			}

			// Receive 1 byte.
			if (ReadRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(recvbuf + BytesReceived), 1, &Bytes) == EXIT_SUCCESS)
			{
				if (Bytes == 0)
				{
					return EXIT_FAILURE;
				}
			}
			else
			{
				return EXIT_FAILURE;
			}

			BytesReceived += Bytes;
		}

		// Analyze data.

		EnterCriticalSection(&StateVariablesCS);

		// To improve...

		tmp = strstr(recvbuf, "?");
		while (tmp)
		{
			if (strncmp(tmp, "?FID", strlen("?FID")) == 0)
			{
				tmp2 = strstr(tmp, "\r");
				if (!tmp2)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				// Echo...
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(tmp), tmp2-tmp+1) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)("FID=Roboteq v0.0 EMULATED 12/12/2023\r"), strlen("FID=Roboteq v0.0 EMULATED 12/12/2023\r")) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
			}
			if (recvbuf-tmp >= MAX_NB_BYTES_ROBOTEQ-2) break;
			tmp = strstr(tmp+1, "?");
		}

		tmp = strstr(recvbuf, "!");
		while (tmp)
		{
			if ((sscanf(tmp, "!G %d %d", &chan, &spd) == 2)||(sscanf(tmp, "!$00 %d %d", &chan, &spd) == 2))
			{
				tmp2 = strstr(tmp, "\r");
				if (!tmp2)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				// Echo...
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(tmp), tmp2-tmp+1) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)("+\r"), strlen("+\r")) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
	
				// Not thread-safe...

				switch (robid)
				{
				case BUGGY_SIMULATOR_ROBID:
				case BUGGY_ROBID:
				case SAILBOAT_SIMULATOR_ROBID:
				case VAIMOS_ROBID:
				case SAILBOAT_ROBID:
				case SAILBOAT2_ROBID:
					if (chan == 1) roboteq_u1 = spd/1000.0;
					if (chan == 2) roboteq_u2 = spd/1000.0;
					u = roboteq_u2;
					uw = roboteq_u1;
					break;
				case BUBBLE_ROBID:
				case ETAS_WHEEL_ROBID:
				case TANK_SIMULATOR_ROBID:
				default:
					if (chan == 1) roboteq_u1 = spd/1000.0;
					if (chan == 2) roboteq_u2 = spd/1000.0;
					u = (roboteq_u1+roboteq_u2)/2;
					uw = (roboteq_u2-roboteq_u1)/2;
					break;
				}

			}
			if (recvbuf-tmp >= MAX_NB_BYTES_ROBOTEQ-2) break;
			tmp = strstr(tmp+1, "!");
		}

		LeaveCriticalSection(&StateVariablesCS);
	}
	else 
	{
		uSleep(1000*50);
	}

	return EXIT_SUCCESS;
}